

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O1

int VP8LHashChainFill(VP8LHashChain *p,int quality,uint32_t *argb,int xsize,int ysize,int low_effort
                     ,WebPPicture *pic,int percent_range,int *percent)

{
  int iVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  void *__s;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint32_t uVar14;
  int iVar15;
  long lVar16;
  uint32_t uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  bool bVar26;
  
  iVar12 = ysize * xsize;
  uVar5 = 0xfff88;
  if (quality < 0x4c) {
    if (quality < 0x33) {
      uVar5 = xsize << ((0x19 < quality) * '\x02' | 4U);
    }
    else {
      uVar5 = xsize << 8;
    }
  }
  uVar13 = 0xfff88;
  if ((int)uVar5 < 0xfff88) {
    uVar13 = uVar5;
  }
  puVar2 = p->offset_length;
  if (iVar12 < 3) {
    puVar2[(long)iVar12 + -1] = 0;
    *puVar2 = 0;
    iVar12 = 1;
  }
  else {
    iVar1 = *percent;
    __s = WebPSafeMalloc(0x40000,4);
    if (__s == (void *)0x0) {
      iVar12 = WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
      return iVar12;
    }
    uVar22 = (uint)(quality * quality) >> 7;
    iVar6 = uVar22 + 8;
    iVar7 = percent_range / 2;
    memset(__s,0xff,0x100000);
    bVar26 = *argb == argb[1];
    uVar18 = iVar12 - 2;
    uVar5 = 0;
    do {
      if ((int)uVar18 <= (int)uVar5) {
        puVar2[uVar5] =
             *(uint32_t *)
              ((long)__s +
              (ulong)(argb[uVar5] * 0x5bd1e996 + argb[(ulong)uVar5 + 1] * -0x395b586d >> 0xe) * 4);
        WebPSafeFree(__s);
        iVar10 = WebPReportProgress(pic,iVar7 + iVar1,percent);
        if (iVar10 != 0) {
          puVar3 = p->offset_length;
          puVar3[iVar12 - 1U] = 0;
          *puVar3 = 0;
          iVar10 = uVar22 + 7;
          uVar5 = uVar18;
          do {
            if (uVar5 == 0) {
              iVar12 = WebPReportProgress(pic,iVar1 + percent_range,percent);
              return iVar12;
            }
            iVar11 = (iVar12 - 1U) - uVar5;
            iVar9 = 0xfff;
            if (iVar11 < 0xfff) {
              iVar9 = iVar11;
            }
            uVar20 = 0;
            uVar21 = (ulong)(uVar5 - uVar13);
            if (uVar5 < uVar13) {
              uVar21 = uVar20;
            }
            if (0xff < iVar11) {
              iVar11 = 0x100;
            }
            puVar3 = argb + uVar5;
            uVar14 = puVar2[uVar5];
            iVar15 = (int)uVar21;
            if (low_effort == 0) {
              uVar25 = 0;
              uVar21 = 0;
              iVar23 = iVar6;
              uVar22 = 0;
              if ((uint)xsize <= uVar5) {
                uVar19 = 0;
                if (puVar3[-(ulong)(uint)xsize] == *puVar3) {
                  uVar19 = (*VP8LVectorMismatch)(puVar3 + -(ulong)(uint)xsize,puVar3,iVar9);
                }
                uVar22 = uVar19;
                if ((int)uVar19 < 1) {
                  uVar22 = 0;
                }
                uVar21 = (ulong)uVar22;
                iVar23 = iVar10;
                uVar22 = 0;
                if (0 < (int)uVar19) {
                  uVar22 = xsize;
                }
              }
              if (puVar3[uVar21 - 1] == puVar3[uVar21]) {
                uVar19 = (*VP8LVectorMismatch)(puVar3 + -1,puVar3,iVar9);
                uVar25 = (ulong)uVar19;
              }
              uVar20 = uVar21;
              if ((int)uVar21 < (int)uVar25) {
                uVar20 = uVar25;
              }
              if ((int)uVar21 < (int)uVar25) {
                uVar22 = 1;
              }
              iVar23 = iVar23 + -1;
              if ((int)uVar20 == 0xfff) {
                uVar14 = iVar15 - 1;
              }
            }
            else {
              uVar22 = 0;
              iVar23 = iVar6;
            }
            if (iVar15 <= (int)uVar14) {
              uVar17 = puVar3[uVar20];
              while (iVar23 = iVar23 + -1, iVar23 != 0) {
                if (argb[(int)((int)uVar20 + uVar14)] == uVar17) {
                  uVar19 = (*VP8LVectorMismatch)(argb + (int)uVar14,puVar3,iVar9);
                  if ((int)uVar20 < (int)uVar19) {
                    uVar22 = uVar5 - uVar14;
                    uVar17 = puVar3[uVar19];
                    bVar26 = iVar11 <= (int)uVar19;
                    uVar20 = (ulong)uVar19;
                  }
                  else {
                    bVar26 = false;
                  }
                }
                else {
                  bVar26 = false;
                }
                if ((bVar26) || (uVar14 = puVar2[(int)uVar14], (int)uVar14 < iVar15)) break;
              }
            }
            puVar3 = p->offset_length;
            uVar19 = uVar5 - 1;
            puVar3[uVar5] = (uint)uVar20 | uVar22 << 0xc;
            uVar8 = uVar19;
            if ((uVar22 != 0) && ((uVar19 != 0 && (uVar22 <= uVar19)))) {
              uVar4 = uVar5 - 2;
              while ((uVar24 = uVar4 + 1, uVar8 = uVar19, argb[(uVar4 - uVar22) + 1] == argb[uVar24]
                     && (((iVar11 = (int)uVar20, uVar22 == 1 || (iVar11 != 0xfff)) ||
                         (uVar8 = uVar24, uVar5 <= uVar4 + 0x1000))))) {
                if (iVar11 < 0xfff) {
                  uVar5 = uVar24;
                }
                uVar8 = iVar11 + (uint)(iVar11 < 0xfff);
                uVar20 = (ulong)uVar8;
                puVar3[uVar24] = uVar8 | uVar22 << 0xc;
                uVar8 = uVar4;
                if (((uVar22 == 0) || (uVar4 == 0)) ||
                   (uVar19 = uVar19 - 1, bVar26 = uVar4 < uVar22, uVar4 = uVar4 - 1, bVar26)) break;
              }
            }
            uVar5 = uVar8;
            iVar11 = WebPReportProgress(pic,((uVar18 - uVar5) * (percent_range - iVar7)) / uVar18 +
                                            iVar7 + iVar1,percent);
            if (iVar11 == 0) {
              return 0;
            }
          } while( true );
        }
        goto LAB_00144f9f;
      }
      if ((bVar26) && (argb[(long)(int)uVar5 + 1] == argb[(long)(int)uVar5 + 2])) {
        uVar14 = argb[(int)uVar5];
        uVar19 = 1;
        if ((int)(uVar5 + 3) < iVar12) {
          uVar19 = uVar18 - uVar5;
          iVar10 = 3;
          do {
            if (argb[uVar5 + iVar10] != uVar14) {
              uVar19 = iVar10 - 2;
              break;
            }
            iVar10 = iVar10 + 1;
          } while ((uVar5 - iVar12) + iVar10 != 0);
        }
        uVar8 = uVar19;
        if (0xfff < uVar19) {
          memset(puVar2 + (int)uVar5,0xff,(ulong)(uVar19 - 0xfff) << 2);
          uVar5 = (uVar5 + uVar19) - 0xfff;
          uVar8 = 0xfff;
        }
        bVar26 = false;
        if (uVar8 != 0) {
          if (0xffe < uVar19) {
            uVar19 = 0xfff;
          }
          uVar8 = uVar14 * 0x5bd1e996 + uVar8 * -0x395b586d;
          lVar16 = 0;
          do {
            puVar2[(int)uVar5 + lVar16] = *(uint32_t *)((long)__s + (ulong)(uVar8 >> 0xe) * 4);
            *(uint *)((long)__s + (ulong)(uVar8 >> 0xe) * 4) = uVar5 + (int)lVar16;
            lVar16 = lVar16 + 1;
            uVar8 = uVar8 + 0x395b586d;
          } while (uVar19 != (uint)lVar16);
          uVar5 = uVar5 + (uint)lVar16;
        }
      }
      else {
        bVar26 = argb[(long)(int)uVar5 + 1] == argb[(long)(int)uVar5 + 2];
        uVar21 = (ulong)(argb[(int)uVar5] * 0x5bd1e996 + argb[(long)(int)uVar5 + 1] * -0x395b586d >>
                        0xe);
        puVar2[(int)uVar5] = *(uint32_t *)((long)__s + uVar21 * 4);
        *(uint *)((long)__s + uVar21 * 4) = uVar5;
        uVar5 = uVar5 + 1;
      }
      iVar10 = WebPReportProgress(pic,(int)(uVar5 * iVar7) / (int)uVar18 + iVar1,percent);
    } while (iVar10 != 0);
    WebPSafeFree(__s);
LAB_00144f9f:
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

int VP8LHashChainFill(VP8LHashChain* const p, int quality,
                      const uint32_t* const argb, int xsize, int ysize,
                      int low_effort, const WebPPicture* const pic,
                      int percent_range, int* const percent) {
  const int size = xsize * ysize;
  const int iter_max = GetMaxItersForQuality(quality);
  const uint32_t window_size = GetWindowSizeForHashChain(quality, xsize);
  int remaining_percent = percent_range;
  int percent_start = *percent;
  int pos;
  int argb_comp;
  uint32_t base_position;
  int32_t* hash_to_first_index;
  // Temporarily use the p->offset_length as a hash chain.
  int32_t* chain = (int32_t*)p->offset_length;
  assert(size > 0);
  assert(p->size != 0);
  assert(p->offset_length != NULL);

  if (size <= 2) {
    p->offset_length[0] = p->offset_length[size - 1] = 0;
    return 1;
  }

  hash_to_first_index =
      (int32_t*)WebPSafeMalloc(HASH_SIZE, sizeof(*hash_to_first_index));
  if (hash_to_first_index == NULL) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }

  percent_range = remaining_percent / 2;
  remaining_percent -= percent_range;

  // Set the int32_t array to -1.
  memset(hash_to_first_index, 0xff, HASH_SIZE * sizeof(*hash_to_first_index));
  // Fill the chain linking pixels with the same hash.
  argb_comp = (argb[0] == argb[1]);
  for (pos = 0; pos < size - 2;) {
    uint32_t hash_code;
    const int argb_comp_next = (argb[pos + 1] == argb[pos + 2]);
    if (argb_comp && argb_comp_next) {
      // Consecutive pixels with the same color will share the same hash.
      // We therefore use a different hash: the color and its repetition
      // length.
      uint32_t tmp[2];
      uint32_t len = 1;
      tmp[0] = argb[pos];
      // Figure out how far the pixels are the same.
      // The last pixel has a different 64 bit hash, as its next pixel does
      // not have the same color, so we just need to get to the last pixel equal
      // to its follower.
      while (pos + (int)len + 2 < size && argb[pos + len + 2] == argb[pos]) {
        ++len;
      }
      if (len > MAX_LENGTH) {
        // Skip the pixels that match for distance=1 and length>MAX_LENGTH
        // because they are linked to their predecessor and we automatically
        // check that in the main for loop below. Skipping means setting no
        // predecessor in the chain, hence -1.
        memset(chain + pos, 0xff, (len - MAX_LENGTH) * sizeof(*chain));
        pos += len - MAX_LENGTH;
        len = MAX_LENGTH;
      }
      // Process the rest of the hash chain.
      while (len) {
        tmp[1] = len--;
        hash_code = GetPixPairHash64(tmp);
        chain[pos] = hash_to_first_index[hash_code];
        hash_to_first_index[hash_code] = pos++;
      }
      argb_comp = 0;
    } else {
      // Just move one pixel forward.
      hash_code = GetPixPairHash64(argb + pos);
      chain[pos] = hash_to_first_index[hash_code];
      hash_to_first_index[hash_code] = pos++;
      argb_comp = argb_comp_next;
    }

    if (!WebPReportProgress(
            pic, percent_start + percent_range * pos / (size - 2), percent)) {
      WebPSafeFree(hash_to_first_index);
      return 0;
    }
  }
  // Process the penultimate pixel.
  chain[pos] = hash_to_first_index[GetPixPairHash64(argb + pos)];

  WebPSafeFree(hash_to_first_index);

  percent_start += percent_range;
  if (!WebPReportProgress(pic, percent_start, percent)) return 0;
  percent_range = remaining_percent;

  // Find the best match interval at each pixel, defined by an offset to the
  // pixel and a length. The right-most pixel cannot match anything to the right
  // (hence a best length of 0) and the left-most pixel nothing to the left
  // (hence an offset of 0).
  assert(size > 2);
  p->offset_length[0] = p->offset_length[size - 1] = 0;
  for (base_position = size - 2; base_position > 0;) {
    const int max_len = MaxFindCopyLength(size - 1 - base_position);
    const uint32_t* const argb_start = argb + base_position;
    int iter = iter_max;
    int best_length = 0;
    uint32_t best_distance = 0;
    uint32_t best_argb;
    const int min_pos =
        (base_position > window_size) ? base_position - window_size : 0;
    const int length_max = (max_len < 256) ? max_len : 256;
    uint32_t max_base_position;

    pos = chain[base_position];
    if (!low_effort) {
      int curr_length;
      // Heuristic: use the comparison with the above line as an initialization.
      if (base_position >= (uint32_t)xsize) {
        curr_length = FindMatchLength(argb_start - xsize, argb_start,
                                      best_length, max_len);
        if (curr_length > best_length) {
          best_length = curr_length;
          best_distance = xsize;
        }
        --iter;
      }
      // Heuristic: compare to the previous pixel.
      curr_length =
          FindMatchLength(argb_start - 1, argb_start, best_length, max_len);
      if (curr_length > best_length) {
        best_length = curr_length;
        best_distance = 1;
      }
      --iter;
      // Skip the for loop if we already have the maximum.
      if (best_length == MAX_LENGTH) pos = min_pos - 1;
    }
    best_argb = argb_start[best_length];

    for (; pos >= min_pos && --iter; pos = chain[pos]) {
      int curr_length;
      assert(base_position > (uint32_t)pos);

      if (argb[pos + best_length] != best_argb) continue;

      curr_length = VP8LVectorMismatch(argb + pos, argb_start, max_len);
      if (best_length < curr_length) {
        best_length = curr_length;
        best_distance = base_position - pos;
        best_argb = argb_start[best_length];
        // Stop if we have reached a good enough length.
        if (best_length >= length_max) break;
      }
    }
    // We have the best match but in case the two intervals continue matching
    // to the left, we have the best matches for the left-extended pixels.
    max_base_position = base_position;
    while (1) {
      assert(best_length <= MAX_LENGTH);
      assert(best_distance <= WINDOW_SIZE);
      p->offset_length[base_position] =
          (best_distance << MAX_LENGTH_BITS) | (uint32_t)best_length;
      --base_position;
      // Stop if we don't have a match or if we are out of bounds.
      if (best_distance == 0 || base_position == 0) break;
      // Stop if we cannot extend the matching intervals to the left.
      if (base_position < best_distance ||
          argb[base_position - best_distance] != argb[base_position]) {
        break;
      }
      // Stop if we are matching at its limit because there could be a closer
      // matching interval with the same maximum length. Then again, if the
      // matching interval is as close as possible (best_distance == 1), we will
      // never find anything better so let's continue.
      if (best_length == MAX_LENGTH && best_distance != 1 &&
          base_position + MAX_LENGTH < max_base_position) {
        break;
      }
      if (best_length < MAX_LENGTH) {
        ++best_length;
        max_base_position = base_position;
      }
    }

    if (!WebPReportProgress(pic,
                            percent_start + percent_range *
                                                (size - 2 - base_position) /
                                                (size - 2),
                            percent)) {
      return 0;
    }
  }

  return WebPReportProgress(pic, percent_start + percent_range, percent);
}